

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BHeap.h
# Opt level: O3

void __thiscall
ADS::BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator>::bubbleUp
          (BHeap<ADS::NodeDistancePairClass_*,_ADS::NDPObjPointerComparator> *this,
          BNode<ADS::NodeDistancePairClass_*> *pNode)

{
  uint uVar1;
  uint uVar2;
  BNode<ADS::NodeDistancePairClass_*> *pNode2;
  
  pNode2 = pNode->pParent;
  while (pNode2 != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
    uVar1 = (((pNode->super_Node<ADS::NodeDistancePairClass_*>).el)->
            super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    uVar2 = (((pNode2->super_Node<ADS::NodeDistancePairClass_*>).el)->
            super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    if (this->_bIsMinHeap == true) {
      if (uVar2 <= uVar1) {
        return;
      }
    }
    else if (uVar1 <= uVar2) {
      return;
    }
    swap(this,pNode,pNode2);
    pNode2 = pNode->pParent;
  }
  if (this->_pHead != (BNode<ADS::NodeDistancePairClass_*> *)0x0) {
    uVar1 = (((pNode->super_Node<ADS::NodeDistancePairClass_*>).el)->
            super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    uVar2 = (((this->_pHead->super_Node<ADS::NodeDistancePairClass_*>).el)->
            super_NodeDistancePair<unsigned_int,_unsigned_int>)._cost;
    if (this->_bIsMinHeap == true) {
      if (uVar2 <= uVar1) {
        return;
      }
    }
    else if (uVar1 <= uVar2) {
      return;
    }
  }
  this->_pHead = pNode;
  return;
}

Assistant:

void BHeap<T, Comparator>::bubbleUp (BNode<T> *pNode)
    {
        while (pNode->pParent != NULL) {
            if (isHead (pNode, pNode->pParent))
                swap (pNode, pNode->pParent);
            else
                break;
        }

        if (pNode->pParent == NULL)
            /* it made it to the root - it may be the new head */
            if (isHead (pNode, _pHead))
                _pHead = pNode;
    }